

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflags.h
# Opt level: O3

QRect QStyle::alignedRect(LayoutDirection direction,Alignment alignment,QSize *size,QRect *rectangle
                         )

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  bool bVar8;
  QRect QVar9;
  
  bVar8 = ((uint)alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1f) == 0;
  bVar2 = bVar8 | (byte)alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                        super_QFlagsStorage<Qt::AlignmentFlag>.i;
  bVar7 = bVar2 ^ 3;
  if (direction != RightToLeft) {
    bVar7 = bVar2;
  }
  if (!bVar8 && ((uint)alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i & 3) == 0) {
    bVar7 = bVar2;
  }
  if (((uint)alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x10) != 0) {
    bVar7 = bVar2;
  }
  iVar4 = (rectangle->y1).m_i;
  iVar1 = (size->ht).m_i;
  if ((char)bVar7 < '\0') {
    iVar5 = (rectangle->y2).m_i - iVar4;
    iVar4 = (iVar4 - iVar1 / 2) + ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1);
  }
  else if ((bVar7 & 0x40) != 0) {
    iVar4 = ((rectangle->y2).m_i - iVar1) + 1;
  }
  iVar5 = (size->wd).m_i;
  if ((bVar7 & 2) == 0) {
    iVar6 = (rectangle->x1).m_i;
    if ((bVar7 & 4) != 0) {
      iVar3 = (rectangle->x2).m_i - iVar6;
      iVar6 = (iVar6 - iVar5 / 2) + ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1);
    }
  }
  else {
    iVar6 = ((rectangle->x2).m_i - iVar5) + 1;
  }
  QVar9.x2.m_i = iVar5 + iVar6 + -1;
  QVar9.y1.m_i = iVar4;
  QVar9.x1.m_i = iVar6;
  QVar9.y2.m_i = iVar1 + iVar4 + -1;
  return QVar9;
}

Assistant:

constexpr inline bool operator!() const noexcept { return !i; }